

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O3

Excluded s2pred::GetVoronoiSiteExclusion
                   (S2Point *a,S2Point *b,S2Point *x0,S2Point *x1,S1ChordAngle r)

{
  double dVar1;
  double dVar2;
  int iVar3;
  Excluded EVar4;
  long lVar5;
  double *ap;
  bool bVar6;
  S1ChordAngle local_120;
  undefined1 local_118 [16];
  longdouble local_108;
  longdouble local_f8;
  double local_e0;
  ExactFloat local_d8;
  Vector3_xf local_c8;
  Vector3_xf local_98;
  Vector3_xf local_68;
  
  local_120.length2_ = r.length2_;
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)local_118,2.0);
  if ((double)local_118._0_8_ <= local_120.length2_) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)local_118,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,0x56b,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)CONCAT62(local_118._10_6_,local_118._8_2_),
               "Check failed: (r) < (S1ChordAngle::Right()) ",0x2c);
  }
  else {
    iVar3 = CompareDistances(x0,a,b);
    if (iVar3 < 0) {
      iVar3 = CompareEdgeDistance(a,x0,x1,local_120);
      if (iVar3 < 1) {
        iVar3 = CompareEdgeDistance(b,x0,x1,local_120);
        if (iVar3 < 1) {
          local_118._10_6_ = (uint6)((ulong)x1->c_[1] >> 0x10) ^ 0x800000000000;
          local_118._0_8_ = -x1->c_[0];
          local_118._8_2_ = SUB82(x1->c_[1],0);
          local_108 = (longdouble)CONCAT28(local_108._8_2_,-x1->c_[2]);
          lVar5 = 0;
          do {
            dVar1 = *(double *)((long)x0->c_ + lVar5);
            dVar2 = *(double *)(local_118 + lVar5);
            if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
            bVar6 = lVar5 != 0x10;
            lVar5 = lVar5 + 8;
          } while (bVar6);
          if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
            iVar3 = CompareDistances(x1,a,b);
            if (iVar3 < 0) {
              EVar4 = SECOND;
            }
            else {
              EVar4 = TriageVoronoiSiteExclusion<double>(a,b,x0,x1,local_120.length2_);
              if (EVar4 == UNCERTAIN) {
                local_108 = (longdouble)a->c_[1];
                local_f8 = (longdouble)a->c_[2];
                local_118._0_8_ = SUB108((longdouble)a->c_[0],0);
                local_118._8_2_ = (undefined2)((unkuint10)(longdouble)a->c_[0] >> 0x40);
                local_c8.c_[1]._0_10_ = (BADTYPE)b->c_[1];
                local_c8.c_[2]._0_10_ = (BADTYPE)b->c_[2];
                local_c8.c_[0]._0_8_ = SUB108((longdouble)b->c_[0],0);
                local_c8.c_[0].bn_.bn_._0_2_ = (undefined2)((unkuint10)(longdouble)b->c_[0] >> 0x40)
                ;
                local_68.c_[0]._0_10_ = (BADTYPE)x0->c_[0];
                local_68.c_[1]._0_10_ = (BADTYPE)x0->c_[1];
                local_68.c_[2]._0_10_ = (BADTYPE)x0->c_[2];
                local_98.c_[0]._0_10_ = (BADTYPE)x1->c_[0];
                local_98.c_[1]._0_10_ = (BADTYPE)x1->c_[1];
                local_98.c_[2]._0_10_ = (BADTYPE)x1->c_[2];
                local_e0 = local_120.length2_;
                EVar4 = TriageVoronoiSiteExclusion<long_double>
                                  ((Vector3<long_double> *)local_118,
                                   (Vector3<long_double> *)&local_c8,
                                   (Vector3<long_double> *)&local_68,
                                   (Vector3<long_double> *)&local_98,(longdouble)local_120.length2_)
                ;
                if (EVar4 == UNCERTAIN) {
                  util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
                  GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                            (local_118,(BasicVector<Vector3,ExactFloat,3ul> *)a);
                  util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
                  GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                            (&local_c8,(BasicVector<Vector3,ExactFloat,3ul> *)b);
                  util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
                  GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                            (&local_68,(BasicVector<Vector3,ExactFloat,3ul> *)x0);
                  util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
                  GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                            (&local_98,(BasicVector<Vector3,ExactFloat,3ul> *)x1);
                  ExactFloat::ExactFloat(&local_d8,local_120.length2_);
                  EVar4 = ExactVoronoiSiteExclusion
                                    ((Vector3_xf *)local_118,&local_c8,&local_68,&local_98,&local_d8
                                    );
                  BN_free((BIGNUM *)local_d8.bn_.bn_);
                  lVar5 = 0x30;
                  do {
                    BN_free(*(BIGNUM **)((long)&local_c8.c_[2].bn_.bn_ + lVar5));
                    lVar5 = lVar5 + -0x10;
                  } while (lVar5 != 0);
                  lVar5 = 0x30;
                  do {
                    BN_free(*(BIGNUM **)((long)&local_98.c_[2].bn_.bn_ + lVar5));
                    lVar5 = lVar5 + -0x10;
                  } while (lVar5 != 0);
                  lVar5 = 0x30;
                  do {
                    BN_free(*(BIGNUM **)((long)local_c8.c_ + lVar5 + -8));
                    lVar5 = lVar5 + -0x10;
                  } while (lVar5 != 0);
                  lVar5 = 0x30;
                  do {
                    BN_free(*(BIGNUM **)((long)&local_120.length2_ + lVar5));
                    lVar5 = lVar5 + -0x10;
                  } while (lVar5 != 0);
                }
              }
            }
            return EVar4;
          }
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)&local_c8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
                     ,0x571,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)CONCAT62(local_c8.c_[0].bn_.bn_._2_6_,local_c8.c_[0].bn_.bn_._0_2_),
                     "Check failed: (x0) != (-x1) ",0x1c);
        }
        else {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)local_118,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
                     ,0x56e,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)CONCAT62(local_118._10_6_,local_118._8_2_),
                     "Check failed: (s2pred::CompareEdgeDistance(b, x0, x1, r)) <= (0) ",0x41);
        }
      }
      else {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)local_118,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
                   ,0x56d,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)CONCAT62(local_118._10_6_,local_118._8_2_),
                   "Check failed: (s2pred::CompareEdgeDistance(a, x0, x1, r)) <= (0) ",0x41);
      }
    }
    else {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)local_118,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
                 ,0x56c,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)CONCAT62(local_118._10_6_,local_118._8_2_),
                 "Check failed: (s2pred::CompareDistances(x0, a, b)) < (0) ",0x39);
    }
  }
  abort();
}

Assistant:

Excluded GetVoronoiSiteExclusion(const S2Point& a, const S2Point& b,
                                 const S2Point& x0, const S2Point& x1,
                                 S1ChordAngle r) {
  S2_DCHECK_LT(r, S1ChordAngle::Right());
  S2_DCHECK_LT(s2pred::CompareDistances(x0, a, b), 0);  // (implies a != b)
  S2_DCHECK_LE(s2pred::CompareEdgeDistance(a, x0, x1, r), 0);
  S2_DCHECK_LE(s2pred::CompareEdgeDistance(b, x0, x1, r), 0);
  // Check that the edge does not consist of antipodal points.  (This catches
  // the most common case -- the full test is in ExactVoronoiSiteExclusion.)
  S2_DCHECK_NE(x0, -x1);

  // If one site is closer than the other to both endpoints of X, then it is
  // closer to every point on X.  Note that this also handles the case where A
  // and B are equidistant from every point on X (i.e., X is the perpendicular
  // bisector of AB), because CompareDistances uses symbolic perturbations to
  // ensure that either A or B is considered closer (in a consistent way).
  // This also ensures that the choice of A or B does not depend on the
  // direction of X.
  if (s2pred::CompareDistances(x1, a, b) < 0) {
    return Excluded::SECOND;  // Site A is closer to every point on X.
  }

  Excluded result = TriageVoronoiSiteExclusion(a, b, x0, x1, r.length2());
  if (result != Excluded::UNCERTAIN) return result;

  result = TriageVoronoiSiteExclusion(ToLD(a), ToLD(b), ToLD(x0), ToLD(x1),
                                      ToLD(r.length2()));
  if (result != Excluded::UNCERTAIN) return result;

  return ExactVoronoiSiteExclusion(ToExact(a), ToExact(b), ToExact(x0),
                                   ToExact(x1), r.length2());
}